

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O0

uint8_t * __thiscall
MPEGPictureHeader::deserialize(MPEGPictureHeader *this,uint8_t *buf,int64_t buf_size)

{
  bool bVar1;
  uchar uVar2;
  short sVar3;
  uint16_t uVar4;
  PictureCodingType PVar5;
  uint8_t *new_buff;
  int64_t buf_size_local;
  uint8_t *buf_local;
  MPEGPictureHeader *this_local;
  
  BitStreamReader::setBuffer(&this->bitReader,buf,buf + buf_size);
  sVar3 = BitStreamReader::getBits<short>(&this->bitReader,10);
  *(short *)&(this->super_MPEGRawDataHeader).field_0x1c = sVar3;
  PVar5 = BitStreamReader::getBits(&this->bitReader,3);
  this->pict_type = PVar5;
  if ((this->pict_type == FORBIDDEN) || (this->pict_type == D_FRAME)) {
    this_local = (MPEGPictureHeader *)0x0;
  }
  else {
    uVar4 = BitStreamReader::getBits<short>(&this->bitReader,0x10);
    this->vbv_delay = uVar4;
    if ((this->pict_type == P_FRAME) || (this->pict_type == B_FRAME)) {
      bVar1 = BitStreamReader::getBit(&this->bitReader);
      this->full_pel[0] = (uint)bVar1;
      uVar2 = BitStreamReader::getBits<unsigned_char>(&this->bitReader,3);
      this->f_code = uVar2;
      this->mpeg_f_code[0][0] = this->f_code;
      this->mpeg_f_code[0][1] = this->f_code;
    }
    if (this->pict_type == B_FRAME) {
      bVar1 = BitStreamReader::getBit(&this->bitReader);
      this->full_pel[1] = (uint)bVar1;
      uVar2 = BitStreamReader::getBits<unsigned_char>(&this->bitReader,3);
      this->f_code = uVar2;
      this->mpeg_f_code[1][0] = this->f_code;
      this->mpeg_f_code[1][1] = this->f_code;
    }
    this_local = (MPEGPictureHeader *)MPEGHeader::skipProcessedBytes(&this->bitReader);
    this->m_headerSize = (int)this_local - (int)buf;
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t* MPEGPictureHeader::deserialize(uint8_t* buf, const int64_t buf_size)
{
    bitReader.setBuffer(buf, buf + buf_size);

    ref = bitReader.getBits<int16_t>(10); /* temporal ref */
    pict_type = static_cast<PictureCodingType>(bitReader.getBits(3));
    if (pict_type == PictureCodingType::FORBIDDEN || pict_type == PictureCodingType::D_FRAME)
        return nullptr;

    vbv_delay = bitReader.getBits<int16_t>(16);

    if (pict_type == PictureCodingType::P_FRAME || pict_type == PictureCodingType::B_FRAME)
    {
        full_pel[0] = bitReader.getBit();
        f_code = bitReader.getBits<uint8_t>(3);
        mpeg_f_code[0][0] = f_code;
        mpeg_f_code[0][1] = f_code;
    }
    if (pict_type == PictureCodingType::B_FRAME)
    {
        full_pel[1] = bitReader.getBit();
        f_code = bitReader.getBits<uint8_t>(3);
        mpeg_f_code[1][0] = f_code;
        mpeg_f_code[1][1] = f_code;
    }
    uint8_t* new_buff = skipProcessedBytes(bitReader);
    m_headerSize = static_cast<int>(new_buff - buf);
    return new_buff;
}